

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForLoopStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ForLoopStatement,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
          (BumpAllocator *this,span<const_slang::ast::Expression_*,_18446744073709551615UL> *args,
          Expression **args_1,span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_2,
          Statement *args_3,SourceRange *args_4)

{
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> steps;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> initializers;
  SourceRange sourceRange;
  ForLoopStatement *pFVar1;
  undefined8 *in_RDX;
  SourceLocation in_R9;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *in_stack_ffffffffffffff88;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffff90;
  ForLoopStatement *this_00;
  BumpAllocator *in_stack_ffffffffffffff98;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffb0;
  Statement *in_stack_ffffffffffffffc0;
  SourceLocation in_stack_ffffffffffffffc8;
  
  pFVar1 = (ForLoopStatement *)
           allocate(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                    (size_t)in_stack_ffffffffffffff88);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_00 = (ForLoopStatement *)*in_RDX;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL>
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)this_00,
             in_stack_ffffffffffffff88);
  initializers._M_extent._M_extent_value = in_stack_ffffffffffffffb0._M_extent_value;
  initializers._M_ptr = (pointer)*(Expression **)((long)in_R9 + 8);
  steps._M_extent._M_extent_value = *(size_t *)in_R9;
  steps._M_ptr = (pointer)pFVar1;
  sourceRange.endLoc = in_R9;
  sourceRange.startLoc = in_stack_ffffffffffffffc8;
  ast::ForLoopStatement::ForLoopStatement
            (this_00,initializers,*(Expression **)((long)in_R9 + 8),steps,in_stack_ffffffffffffffc0,
             sourceRange);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }